

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O3

bool __thiscall libwebm::VpxPesParser::Open(VpxPesParser *this,string *pes_file)

{
  iterator __position;
  int iVar1;
  uint64_t __n;
  FILE *__stream;
  bool bVar2;
  uchar local_29;
  
  __n = GetFileSize(pes_file);
  *(uint64_t *)(this + 0x38) = __n;
  if (__n != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),__n);
    __stream = fopen((pes_file->_M_dataplus)._M_p,"rb");
    iVar1 = fgetc(__stream);
    if (iVar1 != -1) {
      do {
        local_29 = (uchar)iVar1;
        __position._M_current = *(uchar **)(this + 0x60);
        if (__position._M_current == *(uchar **)(this + 0x68)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                     __position,&local_29);
        }
        else {
          *__position._M_current = local_29;
          *(long *)(this + 0x60) = *(long *)(this + 0x60) + 1;
        }
        iVar1 = fgetc(__stream);
      } while (iVar1 != -1);
    }
    iVar1 = feof(__stream);
    if (((iVar1 == 0) || (iVar1 = ferror(__stream), iVar1 != 0)) ||
       (*(long *)(this + 0x38) != *(long *)(this + 0x60) - *(long *)(this + 0x58))) {
      bVar2 = false;
    }
    else {
      *(undefined8 *)(this + 0x70) = 0;
      *(undefined4 *)(this + 0x78) = 0;
      bVar2 = true;
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool VpxPesParser::Open(const std::string& pes_file) {
  pes_file_size_ = static_cast<size_t>(libwebm::GetFileSize(pes_file));
  if (pes_file_size_ <= 0)
    return false;
  pes_file_data_.reserve(static_cast<size_t>(pes_file_size_));
  libwebm::FilePtr file = libwebm::FilePtr(std::fopen(pes_file.c_str(), "rb"),
                                           libwebm::FILEDeleter());
  int byte;
  while ((byte = fgetc(file.get())) != EOF) {
    pes_file_data_.push_back(static_cast<std::uint8_t>(byte));
  }

  if (!feof(file.get()) || ferror(file.get()) ||
      pes_file_size_ != pes_file_data_.size()) {
    return false;
  }

  read_pos_ = 0;
  parse_state_ = kFindStartCode;
  return true;
}